

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::before_value
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  reference pvVar1;
  ulong uVar2;
  size_type sVar3;
  reference this_00;
  basic_json_visitor<char> *in_RSI;
  long in_RDI;
  error_code *in_stack_ffffffffffffff98;
  vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>
  *in_stack_ffffffffffffffa0;
  semantic_tag tag;
  value_type *in_stack_ffffffffffffffa8;
  string_view_type *name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined2 uVar4;
  basic_csv_parser<char,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  uVar4 = (undefined2)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  pvVar1 = std::vector<jsoncons::csv::csv_mode,_std::allocator<jsoncons::csv::csv_mode>_>::back
                     (in_stack_ffffffffffffffa0);
  tag = (semantic_tag)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  if (*pvVar1 == header) {
    if (((*(byte *)(in_RDI + 100) & 1) != 0) || ((*(byte *)(in_RDI + 0x66) & 1) != 0)) {
      trim_string_buffer(in_stack_ffffffffffffffe0,SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
    }
    if ((((*(long *)(in_RDI + 0x38) == *(long *)(in_RDI + 0xd0) + *(long *)(in_RDI + 0xe0)) &&
         (*(ulong *)(in_RDI + 0x68) <= *(ulong *)(in_RDI + 0x70))) &&
        (std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::push_back(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8),
        (*(byte *)(in_RDI + 0x44) & 1) != 0)) && (*(char *)(in_RDI + 0x54) == '\x01')) {
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x1c8));
      basic_json_visitor<char>::string_value
                (in_RSI,(string_view_type *)in_stack_ffffffffffffffa8,tag,
                 (ser_context *)in_stack_ffffffffffffff98,(error_code *)0x3f585d);
      *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    }
  }
  else if (((*pvVar1 == data) && (*(char *)(in_RDI + 0x54) == '\x02')) &&
          (((*(byte *)(in_RDI + 0x50) & 1) == 0 ||
           (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)))) {
    name = *(string_view_type **)(in_RDI + 0x70);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x168));
    if (name < (string_view_type *)(sVar3 + *(long *)(in_RDI + 0x88))) {
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(in_RDI + 0x168),*(long *)(in_RDI + 0x70) - *(long *)(in_RDI + 0x88)
                            );
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      basic_json_visitor<char>::key
                ((basic_json_visitor<char> *)in_stack_ffffffffffffffb0,name,(ser_context *)in_RSI,
                 in_stack_ffffffffffffff98);
      *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    }
  }
  return;
}

Assistant:

void before_value(basic_json_visitor<CharT>& visitor, 
        std::error_code& ec)
    {
        switch (stack_.back())
        {
            case csv_mode::header:
                if (trim_leading_inside_quotes_ || trim_trailing_inside_quotes_)
                {
                    trim_string_buffer(trim_leading_inside_quotes_,trim_trailing_inside_quotes_);
                }
                if (line_ == (header_line_+header_line_offset_) && column_index_ >= min_column_names_)
                {
                    column_names_.push_back(buffer_);
                    if (assume_header_ && mapping_kind_ == csv_mapping_kind::n_rows)
                    {
                        visitor.string_value(buffer_, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                }
                break;
            case csv_mode::data:
                if (mapping_kind_ == csv_mapping_kind::n_objects)
                {
                    if (!(ignore_empty_values_ && buffer_.empty()))
                    {
                        if (column_index_ < column_names_.size() + offset_)
                        {
                            visitor.key(column_names_[column_index_ - offset_], *this, ec);
                            more_ = !cursor_mode_;
                        }
                    }
                }
                break;
            default:
                break;
        }
    }